

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::comparatorInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction)

{
  float comparisonValue;
  int comparator;
  int property;
  Atom *sd;
  RigidBody *sd_00;
  float *pfVar1;
  Molecule *mol;
  pointer ppAVar2;
  pointer ppRVar3;
  MoleculeIterator mi;
  SelectionSet bs;
  MoleculeIterator local_50;
  SelectionSet local_48;
  
  comparator = instruction->tok;
  property = instruction->intValue;
  pfVar1 = (float *)std::__any_caster<float>(&instruction->value);
  if (pfVar1 == (float *)0x0) {
    std::__throw_bad_any_cast();
  }
  comparisonValue = *pfVar1;
  createSelectionSets(&local_48,this);
  SelectionSet::clearAll(&local_48);
  local_50._M_node = (_Base_ptr)0x0;
  mol = SimInfo::beginMolecule(this->info,&local_50);
  do {
    if (mol == (Molecule *)0x0) {
      SelectionSet::parallelReduce(__return_storage_ptr__,&local_48);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_48.bitsets_);
      return __return_storage_ptr__;
    }
    compareProperty(this,mol,&local_48,property,comparator,comparisonValue);
    ppAVar2 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar2 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      sd = *ppAVar2;
      while (sd != (Atom *)0x0) {
        ppAVar2 = ppAVar2 + 1;
        compareProperty(this,&sd->super_StuntDouble,&local_48,property,comparator,comparisonValue);
        if (ppAVar2 ==
            (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        sd = *ppAVar2;
      }
    }
    ppRVar3 = (mol->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar3 !=
        (mol->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      sd_00 = *ppRVar3;
      while (sd_00 != (RigidBody *)0x0) {
        ppRVar3 = ppRVar3 + 1;
        compareProperty(this,&sd_00->super_StuntDouble,&local_48,property,comparator,comparisonValue
                       );
        if (ppRVar3 ==
            (mol->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        sd_00 = *ppRVar3;
      }
    }
    mol = SimInfo::nextMolecule(this->info,&local_50);
  } while( true );
}

Assistant:

SelectionSet SelectionEvaluator::comparatorInstruction(
      const Token& instruction) {
    int comparator        = instruction.tok;
    int property          = instruction.intValue;
    float comparisonValue = std::any_cast<float>(instruction.value);
    SelectionSet bs       = createSelectionSets();
    bs.clearAll();

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      compareProperty(mol, bs, property, comparator, comparisonValue);

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        compareProperty(atom, bs, property, comparator, comparisonValue);
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        compareProperty(rb, bs, property, comparator, comparisonValue);
      }
    }

    return bs.parallelReduce();
  }